

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Estimate<double> * __thiscall
Catch::Benchmark::Detail::
bootstrap<double(*&)(__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>)>
          (Estimate<double> *__return_storage_ptr__,Detail *this,double confidence_level,
          iterator first,iterator last,sample *resample,
          _func_double___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>
          **estimator)

{
  double *pdVar1;
  iterator __begin3;
  pointer pdVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  iterator last_00;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  sample jack;
  sample local_48;
  
  last_00._M_current = (double *)resample;
  dVar7 = (double)(*(code *)(resample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start)(this,first._M_current);
  if ((long)first._M_current - (long)this == 8) {
    __return_storage_ptr__->point = dVar7;
    __return_storage_ptr__->lower_bound = dVar7;
    __return_storage_ptr__->upper_bound = dVar7;
    __return_storage_ptr__->confidence_interval = confidence_level;
  }
  else {
    jackknife<double(*&)(__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>)>
              (&local_48,(Detail *)resample,
               (_func_double___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>
                **)this,first,last_00);
    dVar12 = 0.0;
    dVar10 = 0.0;
    for (pdVar3 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar3 != local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish; pdVar3 = pdVar3 + 1) {
      dVar10 = dVar10 + *pdVar3;
    }
    dVar8 = 0.0;
    if ((long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      dVar8 = 0.0;
      dVar12 = 0.0;
      pdVar2 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        dVar11 = dVar10 / (double)((long)local_48.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_finish -
                                   (long)local_48.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start >> 3) - *pdVar2;
        dVar12 = dVar12 + dVar11 * dVar11 * dVar11;
        dVar8 = dVar8 + dVar11 * dVar11;
        pdVar2 = pdVar2 + 1;
      } while (pdVar2 != local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    dVar10 = pow(dVar8,1.5);
    pdVar3 = (double *)*last._M_current;
    pdVar1 = (double *)last._M_current[1];
    lVar6 = (long)pdVar1 - (long)pdVar3 >> 3;
    dVar8 = 0.0;
    if (pdVar1 != pdVar3) {
      lVar5 = 0;
      do {
        lVar5 = lVar5 + (ulong)(*pdVar3 <= dVar7 && dVar7 != *pdVar3);
        pdVar3 = pdVar3 + 1;
      } while (pdVar3 != pdVar1);
      dVar8 = (double)lVar5;
    }
    dVar11 = (double)lVar6;
    dVar8 = dVar8 / dVar11;
    if ((dVar8 != 0.0) || (NAN(dVar8))) {
      dVar8 = normal_quantile(dVar8);
      dVar9 = normal_quantile((1.0 - confidence_level) * 0.5);
      dVar12 = -dVar12 / (dVar10 * 6.0);
      dVar10 = erfc(((dVar8 + dVar9) / (dVar12 * (dVar8 + dVar9) + 1.0) + dVar8) /
                    -1.4142135623730951);
      lVar4 = lround(dVar10 * 0.5 * dVar11);
      lVar5 = 0;
      if (0 < lVar4) {
        lVar5 = lVar4;
      }
      dVar10 = erfc(((dVar8 - dVar9) / (dVar12 * (dVar8 - dVar9) + 1.0) + dVar8) /
                    -1.4142135623730951);
      lVar4 = lround(dVar10 * 0.5 * dVar11);
      lVar6 = lVar6 + -1;
      if (lVar4 <= lVar6) {
        lVar6 = lVar4;
      }
      __return_storage_ptr__->point = dVar7;
      dVar7 = *last._M_current;
      __return_storage_ptr__->lower_bound = *(double *)((long)dVar7 + lVar5 * 8);
      __return_storage_ptr__->upper_bound = *(double *)((long)dVar7 + lVar6 * 8);
    }
    else {
      __return_storage_ptr__->point = dVar7;
      __return_storage_ptr__->lower_bound = dVar7;
      __return_storage_ptr__->upper_bound = dVar7;
    }
    __return_storage_ptr__->confidence_interval = confidence_level;
    if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (double *)0x0) {
      operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Estimate<double> bootstrap( double confidence_level,
                                        std::vector<double>::iterator first,
                                        std::vector<double>::iterator last,
                                        sample const& resample,
                                        Estimator&& estimator ) {
                auto n_samples = last - first;

                double point = estimator(first, last);
                // Degenerate case with a single sample
                if (n_samples == 1) return { point, point, point, confidence_level };

                sample jack = jackknife(estimator, first, last);
                double jack_mean = mean(jack.begin(), jack.end());
                double sum_squares = 0, sum_cubes = 0;
                for (double x : jack) {
                    auto difference = jack_mean - x;
                    auto square = difference * difference;
                    auto cube = square * difference;
                    sum_squares += square; sum_cubes += cube;
                }

                double accel = sum_cubes / (6 * std::pow(sum_squares, 1.5));
                long n = static_cast<long>(resample.size());
                double prob_n = std::count_if(resample.begin(), resample.end(), [point](double x) { return x < point; }) / static_cast<double>(n);
                // degenerate case with uniform samples
                if ( directCompare( prob_n, 0. ) ) {
                    return { point, point, point, confidence_level };
                }

                double bias = normal_quantile(prob_n);
                double z1 = normal_quantile((1. - confidence_level) / 2.);

                auto cumn = [n]( double x ) -> long {
                    return std::lround( normal_cdf( x ) * static_cast<double>(n) );
                };
                auto a = [bias, accel](double b) { return bias + b / (1. - accel * b); };
                double b1 = bias + z1;
                double b2 = bias - z1;
                double a1 = a(b1);
                double a2 = a(b2);
                auto lo = static_cast<size_t>((std::max)(cumn(a1), 0l));
                auto hi = static_cast<size_t>((std::min)(cumn(a2), n - 1));

                return { point, resample[lo], resample[hi], confidence_level };
            }